

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void __thiscall
HttpSession::send_lambda::operator()
          (send_lambda *this,
          message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
          *msg)

{
  HttpSession *__r;
  size_holder<true,_unsigned_long,_void> msg_00;
  shared_ptr<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  message;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  size_holder<true,_unsigned_long,_void> local_50;
  code *local_40;
  node_ptr local_38;
  color local_30;
  undefined4 uStack_2c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  undefined1 local_20;
  
  std::
  make_shared<boost::beast::http::message<false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,boost::beast::http::message<false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>>
            ((message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)&stack0xffffffffffffffb0);
  std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&this->self_ref->res,
             (__shared_ptr<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              *)&stack0xffffffffffffffb0);
  msg_00.size_ = local_50.size_;
  __r = this->self_ref;
  std::__shared_ptr<HttpSession,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HttpSession,void>
            ((__shared_ptr<HttpSession,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (__weak_ptr<HttpSession,_(__gnu_cxx::_Lock_policy)2> *)__r);
  local_20 = boost::beast::http::
             message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
             ::need_eof((message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                         *)local_50.size_);
  local_40 = on_write;
  local_38 = (node_ptr)0x0;
  local_30 = (color)local_68;
  uStack_2c = local_68._4_4_;
  _Stack_28._M_pi = a_Stack_60[0]._M_pi;
  local_68 = 0;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::beast::http::
  async_write<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>,_boost::beast::detail::bind_front_wrapper<void_(HttpSession::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<HttpSession>,_bool>_>
            (&__r->stream,
             (message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)msg_00.size_,
             (bind_front_wrapper<void_(HttpSession::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<HttpSession>,_bool>
              *)&stack0xffffffffffffffc0,(type *)0x0);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffd8);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void operator()(http::message<isRequest, Body, Fields>&& msg) const
        {
            // The lifetime of the message has to extend
            // for the duration of the async operation so
            // we use a shared_ptr to manage it.
            auto message = std::make_shared<http::message<isRequest, Body, Fields>>(std::move(msg));

            // Store a type-erased version of the shared
            // pointer in the class to keep it alive.
            self_ref.res = message;

            // Write the response
            http::async_write(self_ref.stream,
                              *message,
                              beast::bind_front_handler(&HttpSession::on_write,
                                                        self_ref.shared_from_this(),
                                                        message->need_eof()));
        }